

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

error<idx2::idx2_err_code>
idx2::TraverseHierarchy
          (u64 TraverseOrder,v3i *From3,v3i *Dims3,extent *Extent,extent *VolExtent,
          traverse_callback *Callback)

{
  long lVar1;
  bool bVar2;
  code *pcVar3;
  undefined1 auVar4 [11];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  i32 *__src;
  array<idx2::traverse_item> *paVar10;
  u64 *__src_00;
  undefined1 *__src_01;
  undefined8 uVar11;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar12;
  int iVar13;
  bool bVar14;
  extent eVar15;
  error<idx2::idx2_err_code> eVar16;
  char local_b0d;
  char local_afd;
  char local_ae9;
  anon_class_8_1_32d6a57b local_ac8;
  undefined7 local_ac0;
  undefined4 uStack_ab9;
  undefined5 uStack_ab5;
  undefined1 auStack_ab0 [8];
  error<idx2::idx2_err_code> Result;
  int local_a8c;
  int iStack_a88;
  int local_a84;
  undefined8 local_a80;
  int local_a78;
  undefined8 local_a6c;
  int local_a64;
  undefined8 local_a60;
  int local_a58;
  undefined8 local_a4c;
  int local_a44;
  undefined8 local_a40;
  int local_a38;
  undefined8 local_a2c;
  int local_a24;
  undefined8 local_a20;
  int local_a18;
  undefined8 local_a0c;
  int local_a04;
  long local_a00;
  long local_9f8;
  long local_9f0;
  undefined8 local_9e8;
  int local_9e0;
  extent local_9d8;
  undefined8 local_9c4;
  int local_9bc;
  undefined8 local_9b8;
  uint local_9b0;
  undefined8 local_9a4;
  uint local_99c;
  undefined1 local_998 [8];
  extent Skip;
  traverse_item Second;
  traverse_item First;
  int local_908;
  int iStack_904;
  int local_900;
  uint local_8fc;
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_8f8;
  int FD;
  int local_8f0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_8e4;
  int local_8dc;
  undefined1 local_8d8 [8];
  traverse_item Top;
  v3i Dims3Ext;
  undefined1 local_888 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Common_cpp:820:3)>
  __ScopeGuard__820;
  anon_class_8_1_a6e1c188_for_Func __CleanUpFunc__820;
  array<idx2::traverse_item> Stack;
  traverse_callback *Callback_local;
  extent *VolExtent_local;
  extent *Extent_local;
  v3i *Dims3_local;
  v3i *From3_local;
  u64 TraverseOrder_local;
  undefined5 uStack_805;
  undefined8 local_76c;
  undefined8 local_760;
  uint local_758;
  i32 *local_750;
  undefined1 *local_748;
  undefined8 local_73c;
  i32 local_730;
  bool bStack_72c;
  undefined3 uStack_72b;
  int local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  int local_70c;
  int iStack_708;
  undefined8 *local_700;
  i32 *local_6f8;
  undefined1 *local_6f0;
  uint local_6e4;
  u64 *local_6e0;
  uint local_6d4;
  undefined1 *local_6d0;
  uint local_6c4;
  undefined1 *local_6c0;
  uint local_6b4;
  undefined1 *local_6b0;
  uint local_6a4;
  undefined1 *local_6a0;
  uint local_694;
  undefined1 *local_690;
  uint local_684;
  undefined1 *local_680;
  uint local_674;
  undefined1 *local_670;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_668;
  int local_660;
  i32 *local_658;
  v3i *local_650;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_644;
  mallocator *local_638;
  array<idx2::traverse_item> *local_630;
  mallocator *local_628;
  array<idx2::traverse_item> *local_620;
  undefined8 local_618;
  array<idx2::traverse_item> *local_610;
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_5c8;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int *local_5b0;
  uint local_5a4;
  int local_5a0;
  int local_59c;
  undefined8 *local_598;
  int local_58c;
  int local_588;
  int local_584;
  undefined8 *local_580;
  int local_574;
  undefined4 local_570;
  i32 local_56c;
  i32 *local_568;
  i32 *local_560;
  array<idx2::traverse_item> *local_558;
  u64 *local_550;
  array<idx2::traverse_item> *local_548;
  undefined1 *local_540;
  array<idx2::traverse_item> *local_538;
  anon_class_8_1_a6e1c188_for_Func *local_530;
  anon_class_8_1_a6e1c188_for_Func *local_528;
  anon_class_8_1_a6e1c188_for_Func *local_520;
  anon_class_8_1_a6e1c188_for_Func *local_518;
  anon_class_8_1_a6e1c188_for_Func *local_510;
  undefined4 local_504;
  int *local_500;
  undefined8 *local_4f8;
  undefined8 local_4f0;
  int local_4e8;
  undefined8 local_4e0;
  int local_4d8;
  extent *local_4d0;
  undefined8 local_4c8;
  int local_4c0;
  long *local_4b8;
  undefined8 *local_4b0;
  long *local_4a8;
  undefined1 *local_4a0;
  int *local_498;
  undefined8 *local_490;
  i32 *local_488;
  undefined1 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  u64 *local_468;
  undefined8 local_460;
  int local_458;
  undefined8 local_450;
  int local_448;
  undefined8 local_440;
  int local_438;
  undefined8 local_430;
  int local_428;
  undefined8 local_420;
  int local_418;
  undefined8 local_410;
  int local_408;
  extent *local_400;
  undefined8 local_3f8;
  int local_3f0;
  undefined8 local_3e8;
  int local_3e0;
  undefined8 local_3d8;
  int local_3d0;
  extent *local_3c8;
  undefined8 local_3c0;
  int local_3b8;
  undefined8 local_3b0;
  int local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 local_390;
  int local_384;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  undefined8 local_370;
  int local_368;
  undefined8 local_360;
  int local_358;
  extent *local_350;
  undefined8 local_348;
  int local_340;
  undefined8 local_338;
  int local_330;
  undefined8 local_328;
  int local_320;
  undefined8 local_318;
  int local_310;
  undefined8 local_308;
  int local_300;
  undefined8 local_2f8;
  int local_2f0;
  undefined8 local_2e8;
  int local_2e0;
  extent *local_2d8;
  undefined8 local_2d0;
  int local_2c8;
  undefined8 local_2c0;
  int local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  extent *local_2a0;
  undefined8 local_298;
  int local_290;
  undefined8 local_288;
  int local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  undefined8 local_248;
  int local_240;
  undefined8 local_238;
  int local_230;
  extent *local_228;
  undefined8 local_220;
  int local_218;
  undefined8 local_210;
  int local_208;
  u64 local_200;
  undefined8 local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  int local_1d0;
  u64 local_1c8;
  undefined8 local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  int local_198;
  u64 local_190;
  undefined8 local_188;
  int local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  undefined8 local_168;
  int local_160;
  u64 local_158;
  undefined8 local_150;
  int local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  undefined8 local_130;
  int local_128;
  u64 local_120;
  undefined8 local_118;
  int local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  undefined8 local_f8;
  int local_f0;
  u64 local_e8;
  undefined8 local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  idx2_err_code local_c0;
  i8 iStack_bf;
  bool bStack_be;
  undefined5 uStack_bd;
  int local_b8;
  u64 local_b0;
  int local_a8;
  int iStack_a4;
  int local_9c;
  int local_98;
  int local_94;
  int *local_90;
  undefined8 *local_88;
  i32 *local_80;
  undefined1 local_71;
  ulong local_70;
  undefined1 local_61;
  ulong local_60;
  undefined1 local_51;
  ulong local_50;
  undefined1 *local_48;
  anon_class_8_1_a6e1c188_for_Func *local_40;
  long local_38;
  array<idx2::traverse_item> *local_30;
  long local_28;
  array<idx2::traverse_item> *local_20;
  long local_18;
  array<idx2::traverse_item> *local_10;
  
  local_638 = Mallocator();
  local_630 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
  local_628 = Mallocator();
  __CleanUpFunc__820.Stack = (array<idx2::traverse_item> *)0x0;
  Stack.Buffer.Alloc = (allocator *)0x0;
  __ScopeGuard__820._8_8_ = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
  local_620 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp:820:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Common_cpp:820:3)>
                 *)local_888,(anon_class_8_1_a6e1c188_for_Func *)&__ScopeGuard__820.Dismissed);
  local_618 = 0x40;
  local_610 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
  GrowCapacity<idx2::traverse_item>((array<idx2::traverse_item> *)&__CleanUpFunc__820,0x40);
  local_5e8 = (long)(Dims3->field_0).field_0.X;
  if (local_5e8 == 0) {
    local_5e0 = 1;
  }
  else {
    local_70 = local_5e8 - 1;
    local_71 = 0xff;
    if (local_70 == 0) {
      local_ae9 = -1;
    }
    else {
      lVar1 = 0x3f;
      if (local_70 != 0) {
        for (; local_70 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_ae9 = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_5e0 = 1L << (local_ae9 + 1U & 0x3f);
  }
  local_56c = (i32)local_5e0;
  local_5f8 = (long)(Dims3->field_0).field_0.Y;
  if (local_5f8 == 0) {
    local_5f0 = 1;
  }
  else {
    local_60 = local_5f8 - 1;
    local_61 = 0xff;
    if (local_60 == 0) {
      local_afd = -1;
    }
    else {
      lVar1 = 0x3f;
      if (local_60 != 0) {
        for (; local_60 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_afd = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_5f0 = 1L << (local_afd + 1U & 0x3f);
  }
  local_570 = (undefined4)local_5f0;
  local_608 = (long)(Dims3->field_0).field_0.Z;
  if (local_608 == 0) {
    local_600 = 1;
  }
  else {
    local_50 = local_608 - 1;
    local_51 = 0xff;
    if (local_50 == 0) {
      local_b0d = -1;
    }
    else {
      lVar1 = 0x3f;
      if (local_50 != 0) {
        for (; local_50 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_b0d = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_600 = 1L << (local_b0d + 1U & 0x3f);
  }
  local_568 = &Top.ItemOrder;
  iVar13 = (int)local_600;
  local_574 = iVar13;
  Top.ItemOrder = local_56c;
  Top._52_4_ = local_570;
  traverse_item::traverse_item((traverse_item *)local_8d8);
  Top.From3.field_0.field_0.X = (From3->field_0).field_0.Z;
  local_8d8 = *(undefined1 (*) [8])&From3->field_0;
  local_658 = &Top.ItemOrder;
  local_5cc = (From3->field_0).field_0.X + Top.ItemOrder;
  local_5d0 = (From3->field_0).field_0.Y + Top._52_4_;
  local_8f0 = (From3->field_0).field_0.Z + iVar13;
  local_5c8 = &local_644;
  local_644.field_0.X = local_5cc;
  local_644.field_0.Y = local_5d0;
  local_668 = local_644;
  aStack_8f8 = local_644;
  local_8e4 = local_644;
  Top.From3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_644;
  local_538 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
  local_540 = local_8d8;
  local_8dc = local_8f0;
  Top.To3.field_0.field_0.X = local_8f0;
  Top.To3.field_0.field_4.YZ.field_0 = (v2<int>)TraverseOrder;
  Top.TraverseOrder = TraverseOrder;
  local_660 = local_8f0;
  local_650 = From3;
  local_5d4 = local_8f0;
  GrowCapacity<idx2::traverse_item>(local_538,0);
  paVar10 = local_538;
  __src_01 = local_540;
  lVar1 = local_538->Size;
  local_538->Size = lVar1 + 1;
  local_30 = paVar10;
  local_38 = lVar1;
  memcpy((paVar10->Buffer).Data + lVar1 * 0x38,__src_01,0x35);
  aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.TraverseOrder;
  while( true ) {
    while( true ) {
      while( true ) {
        Top.TraverseOrder = (u64)aVar12;
        local_528 = &__CleanUpFunc__820;
        if ((long)Stack.Buffer.Alloc < 0) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        local_520 = &__CleanUpFunc__820;
        local_48 = (undefined1 *)((long)&Stack.Buffer.Alloc[-1]._vptr_allocator + 7);
        local_518 = local_520;
        local_40 = local_520;
        memcpy(local_8d8,(void *)((long)__CleanUpFunc__820.Stack + (long)local_48 * 0x38),0x35);
        local_8fc = Top.To3.field_0._4_4_ & 3;
        Top.To3.field_0.field_4.YZ.field_0 =
             (v2<int>)((ulong)Top.To3.field_0.field_4.YZ.field_0 >> 2);
        if (local_8fc != 3) break;
        aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.To3.field_0.field_4.YZ.field_0;
        if ((anon_union_8_4_6ba14846_for_v2<int>_1)Top.To3.field_0.field_4.YZ.field_0 ==
            (anon_union_8_4_6ba14846_for_v2<int>_1)0x3) {
          Top.To3.field_0.field_4.YZ.field_0 = (v2<int>)Top.TraverseOrder;
          aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.TraverseOrder;
        }
      }
      local_510 = &__CleanUpFunc__820;
      if (0 < (long)Stack.Buffer.Alloc) {
        Stack.Buffer.Alloc = (allocator *)((long)&Stack.Buffer.Alloc[-1]._vptr_allocator + 7);
      }
      local_718 = (undefined1 *)((long)&Top.From3.field_0 + 4);
      local_720 = local_8d8;
      local_5b4 = Top.From3.field_0.field_0.Y - local_8d8._0_4_;
      local_5b8 = Top.From3.field_0.field_0.Z - local_8d8._4_4_;
      local_900 = Top.To3.field_0.field_0.X - Top.From3.field_0._0_4_;
      local_5b0 = &local_70c;
      local_70c = local_5b4;
      iStack_708 = local_5b8;
      local_730 = local_70c;
      bStack_72c = iStack_708._0_1_;
      uStack_72b = iStack_708._1_3_;
      First.ItemOrder = local_70c;
      First.LastItem = iStack_708._0_1_;
      First._53_3_ = iStack_708._1_3_;
      local_908 = local_70c;
      iStack_904._0_1_ = iStack_708._0_1_;
      iStack_904._1_3_ = iStack_708._1_3_;
      uVar6 = _local_908;
      local_500 = &local_908;
      local_504 = 1;
      local_908 = (int)_local_70c;
      bVar14 = false;
      if (local_908 == 1) {
        iStack_904 = SUB84(_local_70c,4);
        bVar14 = false;
        if (iStack_904 == 1) {
          bVar14 = local_900 == 1;
        }
      }
      _local_908 = uVar6;
      local_728 = local_900;
      local_5bc = local_900;
      if (!bVar14) break;
      local_530 = &__CleanUpFunc__820;
      Top.Address._4_1_ = Stack.Buffer.Alloc == (allocator *)0x0;
      eVar16 = (*Callback)((traverse_item *)local_8d8);
      local_ac0 = eVar16.Msg._0_7_;
      uStack_ab9 = eVar16._7_4_;
      uStack_ab5 = eVar16._11_5_;
      auStack_ab0._0_7_ = local_ac0;
      unique0x10000eae = uStack_ab9;
      bVar14 = error::operator_cast_to_bool((error *)auStack_ab0);
      aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.TraverseOrder;
      if (!bVar14) {
        local_ac8.Result = (error<idx2::idx2_err_code> *)auStack_ab0;
        eVar16 = TraverseHierarchy::anon_class_8_1_32d6a57b::operator()(&local_ac8);
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp:820:3)>
        ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Common_cpp:820:3)>
                        *)local_888);
        auVar4 = eVar16._0_11_;
        eVar16._11_5_ = uStack_805;
        eVar16.Msg = (cstr)auVar4._0_8_;
        eVar16.Code = auVar4[8];
        eVar16.StackIdx = auVar4[9];
        eVar16.StrGened = (bool)auVar4[10];
        return eVar16;
      }
    }
    memcpy(&Second.ItemOrder,local_8d8,0x38);
    memcpy(&Skip.Dims,local_8d8,0x38);
    local_670 = local_8d8;
    local_674 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_680 = (undefined1 *)((long)&Top.From3.field_0 + 4);
    local_684 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_690 = local_8d8;
    local_694 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_6a0 = (undefined1 *)((long)&First.From3.field_0 + 4);
    local_6a4 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)(local_6a0 + (long)(int)local_8fc * 4) =
         *(int *)(local_670 + (long)(int)local_8fc * 4) +
         (*(int *)(local_680 + (long)(int)local_8fc * 4) -
         *(int *)(local_690 + (long)(int)local_8fc * 4)) / 2;
    local_6b0 = local_8d8;
    local_6b4 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_6c0 = (undefined1 *)((long)&Top.From3.field_0 + 4);
    local_6c4 = local_8fc;
    if (2 < (int)local_8fc) break;
    local_6d0 = local_8d8;
    local_6d4 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_6e0 = &Skip.Dims;
    local_6e4 = local_8fc;
    if (2 < (int)local_8fc) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)((long)local_6e0 + (long)(int)local_8fc * 4) =
         *(int *)(local_6b0 + (long)(int)local_8fc * 4) +
         (*(int *)(local_6c0 + (long)(int)local_8fc * 4) -
         *(int *)(local_6d0 + (long)(int)local_8fc * 4)) / 2;
    iVar13 = (int)First.Address;
    local_750 = &Second.ItemOrder;
    local_748 = (undefined1 *)((long)&First.From3.field_0 + 4);
    local_59c = First.From3.field_0.field_0.Y - Second.ItemOrder;
    local_5a0 = First.From3.field_0.field_0.Z - Second._52_4_;
    local_9b0 = First.To3.field_0.field_0.X - First.From3.field_0._0_4_;
    local_598 = &local_73c;
    local_73c._0_4_ = local_59c;
    local_73c._4_4_ = local_5a0;
    local_760 = local_73c;
    local_9b8 = local_73c;
    local_9a4 = local_73c;
    uVar6 = local_9a4;
    local_6f0 = local_998;
    local_700 = &local_9a4;
    local_998 = (undefined1  [8])
                ((long)(int)(Second.ItemOrder & 0x1fffff) +
                 (long)(int)(Second._52_4_ & 0x1fffff) * 0x200000 +
                ((long)(int)(First.From3.field_0.field_0.X & 0x1fffff) << 0x2a));
    local_9a4._0_4_ = (uint)local_73c;
    local_9a4._4_4_ = (uint)((ulong)local_73c >> 0x20);
    Skip.From = (long)(int)((uint)local_9a4 & 0x1fffff) +
                (long)(int)(local_9a4._4_4_ & 0x1fffff) * 0x200000 +
                ((long)(int)(local_99c & 0x1fffff) << 0x2a);
    local_9a4 = uVar6;
    local_99c = local_9b0;
    local_758 = local_9b0;
    local_6f8 = local_750;
    local_5a4 = local_9b0;
    local_88 = local_700;
    local_80 = local_750;
    eVar15 = Crop<idx2::extent,idx2::extent>((extent *)local_998,VolExtent);
    local_120 = eVar15.Dims;
    local_4d0 = &local_9d8;
    local_104 = ((int)eVar15.Dims << 0xb) >> 0xb;
    local_100 = &local_118;
    local_108 = (int)((long)(local_120 << 0x16) >> 0x2b);
    local_9e0 = (int)((long)(local_120 * 2) >> 0x2b);
    local_118._0_4_ = local_104;
    local_118._4_4_ = local_108;
    local_130 = local_118;
    local_4e0 = local_118;
    local_4c8 = local_118;
    local_4f0 = local_118;
    local_9e8 = local_118;
    local_9c4 = local_118;
    uVar9 = local_9c4;
    local_4f8 = &local_9c4;
    local_9c4._0_4_ = (int)local_118;
    local_9c4._4_4_ = (int)((ulong)local_118 >> 0x20);
    Second.Address._0_4_ = iVar13 + (int)local_9c4 * local_9c4._4_4_ * local_9e0;
    First.PrevTraverseOrder = Top.PrevTraverseOrder;
    local_584 = First.From3.field_0.field_0.Y - Second.ItemOrder;
    local_588 = First.From3.field_0.field_0.Z - Second._52_4_;
    local_a18 = First.To3.field_0.field_0.X - First.From3.field_0._0_4_;
    local_580 = &local_76c;
    local_76c._0_4_ = local_584;
    local_76c._4_4_ = local_588;
    local_a20 = local_76c;
    local_a0c = local_76c;
    uVar8 = local_a0c;
    local_4a8 = &local_a00;
    local_4b0 = &local_a0c;
    local_a0c._0_4_ = (int)local_76c;
    local_a00 = (long)(int)local_a0c;
    local_a0c._4_4_ = (int)((ulong)local_76c >> 0x20);
    local_9f8 = (long)local_a0c._4_4_;
    local_9f0 = (long)local_a04;
    local_4b8 = &local_a00;
    Second.PrevTraverseOrder = Top.PrevTraverseOrder + local_a00 * local_9f8 * local_9f0;
    local_468 = &Skip.Dims;
    local_1c8 = Extent->From;
    local_1ac = ((int)local_1c8 << 0xb) >> 0xb;
    local_1a8 = &local_1c0;
    local_1b0 = (int)((long)(local_1c8 << 0x16) >> 0x2b);
    local_2f0 = (int)((long)(local_1c8 * 2) >> 0x2b);
    local_1c0._0_4_ = local_1ac;
    local_1c0._4_4_ = local_1b0;
    local_1d8 = local_1c0;
    local_2b0 = local_1c0;
    local_298 = local_1c0;
    local_2c0 = local_1c0;
    local_2f8 = local_1c0;
    local_2e8 = local_1c0;
    uVar11 = local_2e8;
    local_200 = Extent->Dims;
    local_1e4 = ((int)local_200 << 0xb) >> 0xb;
    local_1e0 = &local_1f8;
    local_1e8 = (int)((long)(local_200 << 0x16) >> 0x2b);
    local_310 = (int)((long)(local_200 * 2) >> 0x2b);
    local_1f8._0_4_ = local_1e4;
    local_1f8._4_4_ = local_1e8;
    local_210 = local_1f8;
    local_238 = local_1f8;
    local_220 = local_1f8;
    local_248 = local_1f8;
    local_318 = local_1f8;
    local_308 = local_1f8;
    uVar5 = local_308;
    local_270 = &local_2e8;
    local_278 = &local_308;
    local_2e8._0_4_ = (int)local_1c0;
    local_2e8._4_4_ = (int)((ulong)local_1c0 >> 0x20);
    local_308._0_4_ = (int)local_1f8;
    local_308._4_4_ = (int)((ulong)local_1f8 >> 0x20);
    local_254 = (int)local_2e8 + (int)local_308;
    local_258 = local_2e8._4_4_ + local_308._4_4_;
    local_a38 = local_2f0 + local_310;
    local_250 = &local_268;
    local_268._0_4_ = local_254;
    local_268._4_4_ = local_258;
    local_288 = local_268;
    local_328 = local_268;
    local_2d0 = local_268;
    local_338 = local_268;
    local_a40 = local_268;
    local_a2c = local_268;
    uVar6 = local_a2c;
    local_470 = &local_a2c;
    local_a2c._0_4_ = (int)local_268;
    bVar14 = false;
    if ((int)Skip.Dims < (int)local_a2c) {
      local_a2c._4_4_ = (int)((ulong)local_268 >> 0x20);
      bVar14 = false;
      if (Skip.Dims._4_4_ < local_a2c._4_4_) {
        bVar14 = Second.From3.field_0.field_0.X < local_a38;
      }
    }
    bVar2 = false;
    if (bVar14) {
      local_e8 = Extent->From;
      local_cc = ((int)local_e8 << 0xb) >> 0xb;
      local_c8 = &local_e0;
      local_d0 = (int)((long)(local_e8 << 0x16) >> 0x2b);
      local_a58 = (int)((long)(local_e8 * 2) >> 0x2b);
      local_e0._0_4_ = local_cc;
      local_e0._4_4_ = local_d0;
      local_f8 = local_e0;
      local_a60 = local_e0;
      local_a4c = local_e0;
      uVar7 = local_a4c;
      local_480 = (undefined1 *)((long)&Second.From3.field_0 + 4);
      local_478 = &local_a4c;
      local_a4c._0_4_ = (int)local_e0;
      bVar2 = false;
      bVar14 = (int)local_a4c < Second.From3.field_0.field_0.Y;
      local_a4c = uVar7;
      local_a44 = local_a58;
      local_f0 = local_a58;
      local_d4 = local_a58;
      if (bVar14) {
        local_a4c._4_4_ = (int)((ulong)local_e0 >> 0x20);
        bVar2 = false;
        bVar14 = local_a4c._4_4_ < Second.From3.field_0.field_0.Z;
        if (bVar14) {
          bVar2 = local_a58 < Second.To3.field_0.field_0.X;
        }
      }
    }
    local_a2c = uVar6;
    local_a24 = local_a38;
    local_a0c = uVar8;
    local_a04 = local_a18;
    local_9c4 = uVar9;
    local_9bc = local_9e0;
    local_58c = local_a18;
    local_4e8 = local_9e0;
    local_4d8 = local_9e0;
    local_4c0 = local_9e0;
    local_330 = local_a38;
    local_320 = local_a38;
    local_308 = uVar5;
    local_300 = local_310;
    local_2e8 = uVar11;
    local_2e0 = local_2f0;
    local_2d8 = Extent;
    local_2c8 = local_a38;
    local_2b8 = local_2f0;
    local_2a8 = local_2f0;
    local_2a0 = Extent;
    local_290 = local_2f0;
    local_280 = local_a38;
    local_25c = local_a38;
    local_240 = local_310;
    local_230 = local_310;
    local_228 = Extent;
    local_218 = local_310;
    local_208 = local_310;
    local_1ec = local_310;
    local_1d0 = local_2f0;
    local_1b4 = local_2f0;
    local_128 = local_9e0;
    local_10c = local_9e0;
    if (bVar2) {
      local_548 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
      local_550 = &Skip.Dims;
      local_9d8 = eVar15;
      if (-1 < (long)Stack.Buffer.Alloc) {
        GrowCapacity<idx2::traverse_item>(local_548,0);
      }
      paVar10 = local_548;
      __src_00 = local_550;
      lVar1 = local_548->Size;
      local_548->Size = lVar1 + 1;
      local_20 = paVar10;
      local_28 = lVar1;
      memcpy((paVar10->Buffer).Data + lVar1 * 0x38,__src_00,0x35);
      eVar15 = local_9d8;
    }
    local_488 = &Second.ItemOrder;
    local_158 = Extent->From;
    local_13c = ((int)local_158 << 0xb) >> 0xb;
    local_138 = &local_150;
    local_140 = (int)((long)(local_158 << 0x16) >> 0x2b);
    local_418 = (int)((long)(local_158 * 2) >> 0x2b);
    local_150._0_4_ = local_13c;
    local_150._4_4_ = local_140;
    local_168 = local_150;
    local_3d8 = local_150;
    local_3c0 = local_150;
    local_3e8 = local_150;
    local_420 = local_150;
    local_410 = local_150;
    uVar9 = local_410;
    local_190 = Extent->Dims;
    local_174 = ((int)local_190 << 0xb) >> 0xb;
    local_170 = &local_188;
    local_178 = (int)((long)(local_190 << 0x16) >> 0x2b);
    local_438 = (int)((long)(local_190 * 2) >> 0x2b);
    local_188._0_4_ = local_174;
    local_188._4_4_ = local_178;
    local_1a0 = local_188;
    local_360 = local_188;
    local_348 = local_188;
    local_370 = local_188;
    local_440 = local_188;
    local_430 = local_188;
    uVar8 = local_430;
    local_398 = &local_410;
    local_3a0 = &local_430;
    local_410._0_4_ = (int)local_150;
    local_410._4_4_ = (int)((ulong)local_150 >> 0x20);
    local_430._0_4_ = (int)local_188;
    local_430._4_4_ = (int)((ulong)local_188 >> 0x20);
    local_37c = (int)local_410 + (int)local_430;
    local_380 = local_410._4_4_ + local_430._4_4_;
    local_a78 = local_418 + local_438;
    local_378 = &local_390;
    local_390._0_4_ = local_37c;
    local_390._4_4_ = local_380;
    local_3b0 = local_390;
    local_450 = local_390;
    local_3f8 = local_390;
    local_460 = local_390;
    local_a80 = local_390;
    local_a6c = local_390;
    uVar6 = local_a6c;
    local_490 = &local_a6c;
    local_a6c._0_4_ = (int)local_390;
    bVar14 = false;
    if (Second.ItemOrder < (int)local_a6c) {
      local_a6c._4_4_ = (int)((ulong)local_390 >> 0x20);
      bVar14 = false;
      if ((int)Second._52_4_ < local_a6c._4_4_) {
        bVar14 = First.From3.field_0.field_0.X < local_a78;
      }
    }
    bVar2 = false;
    if (bVar14) {
      local_b0 = Extent->From;
      local_94 = ((int)local_b0 << 0xb) >> 0xb;
      local_90 = &local_a8;
      local_98 = (int)((long)(local_b0 << 0x16) >> 0x2b);
      local_a84 = (int)((long)(local_b0 * 2) >> 0x2b);
      local_a8 = local_94;
      iStack_a4 = local_98;
      local_c0 = (idx2_err_code)local_a8;
      iStack_bf = local_a8._1_1_;
      bStack_be = local_a8._2_1_;
      uStack_bd = stack0xffffffffffffff5b;
      Result.Code = (idx2_err_code)local_a8;
      Result.StackIdx = local_a8._1_1_;
      Result.StrGened = local_a8._2_1_;
      Result._11_5_ = stack0xffffffffffffff5b;
      local_a8c._0_1_ = (idx2_err_code)local_a8;
      local_a8c._1_1_ = local_a8._1_1_;
      local_a8c._2_1_ = local_a8._2_1_;
      stack0xfffffffffffff577 = stack0xffffffffffffff5b;
      uVar5 = _local_a8c;
      local_4a0 = (undefined1 *)((long)&First.From3.field_0 + 4);
      local_498 = &local_a8c;
      local_a8c = (int)_local_a8;
      bVar2 = false;
      bVar14 = local_a8c < First.From3.field_0.field_0.Y;
      _local_a8c = uVar5;
      local_b8 = local_a84;
      local_9c = local_a84;
      if (bVar14) {
        iStack_a88 = SUB84(_local_a8,4);
        bVar2 = false;
        bVar14 = iStack_a88 < First.From3.field_0.field_0.Z;
        if (bVar14) {
          bVar2 = local_a84 < First.To3.field_0.field_0.X;
        }
      }
    }
    local_a6c = uVar6;
    local_a64 = local_a78;
    aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.TraverseOrder;
    local_458 = local_a78;
    local_448 = local_a78;
    local_430 = uVar8;
    local_428 = local_438;
    local_410 = uVar9;
    local_408 = local_418;
    local_400 = Extent;
    local_3f0 = local_a78;
    local_3e0 = local_418;
    local_3d0 = local_418;
    local_3c8 = Extent;
    local_3b8 = local_418;
    local_3a8 = local_a78;
    local_384 = local_a78;
    local_368 = local_438;
    local_358 = local_438;
    local_350 = Extent;
    local_340 = local_438;
    local_198 = local_438;
    local_17c = local_438;
    local_160 = local_418;
    local_144 = local_418;
    local_9d8 = eVar15;
    if (bVar2) {
      local_558 = (array<idx2::traverse_item> *)&__CleanUpFunc__820;
      local_560 = &Second.ItemOrder;
      if (-1 < (long)Stack.Buffer.Alloc) {
        GrowCapacity<idx2::traverse_item>(local_558,0);
      }
      paVar10 = local_558;
      __src = local_560;
      lVar1 = local_558->Size;
      local_558->Size = lVar1 + 1;
      local_10 = paVar10;
      local_18 = lVar1;
      memcpy((paVar10->Buffer).Data + lVar1 * 0x38,__src,0x35);
      aVar12 = (anon_union_8_4_6ba14846_for_v2<int>_1)Top.TraverseOrder;
    }
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}